

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void SetupMatrices(VP8Encoder *enc)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  VP8Matrix *m_00;
  long *in_RDI;
  int q_uv;
  int q_i16;
  int q_i4;
  int q;
  VP8SegmentInfo *m;
  int num_segments;
  int tlambda_scale;
  int i;
  int local_34;
  int local_c;
  
  if ((int)in_RDI[0xb88] < 4) {
    local_34 = 0;
  }
  else {
    local_34 = *(int *)(*in_RDI + 0x1c);
  }
  lVar1 = in_RDI[4];
  for (local_c = 0; local_c < (int)lVar1; local_c = local_c + 1) {
    m_00 = (VP8Matrix *)(in_RDI + (long)local_c * 0x5d + 0x4c);
    iVar3 = *(int *)(m_00[3].q + 4);
    iVar2 = clip(iVar3 + *(int *)((long)in_RDI + 0xe0c),0,0x7f);
    m_00->q[0] = (ushort)kDcTable[iVar2];
    iVar2 = clip(iVar3,0,0x7f);
    m_00->q[1] = kAcTable[iVar2];
    iVar2 = clip(iVar3 + (int)in_RDI[0x1c2],0,0x7f);
    m_00[1].q[0] = (ushort)kDcTable[iVar2] << 1;
    iVar2 = clip(iVar3 + *(int *)((long)in_RDI + 0xe14),0,0x7f);
    m_00[1].q[1] = kAcTable2[iVar2];
    iVar2 = clip(iVar3 + (int)in_RDI[0x1c3],0,0x75);
    m_00[2].q[0] = (ushort)kDcTable[iVar2];
    iVar3 = clip(iVar3 + *(int *)((long)in_RDI + 0xe1c),0,0x7f);
    m_00[2].q[1] = kAcTable[iVar3];
    iVar3 = ExpandMatrix(m_00,0);
    iVar2 = ExpandMatrix(m_00 + 1,1);
    iVar4 = ExpandMatrix(m_00 + 2,2);
    *(int *)(m_00[3].q + 0xe) = iVar3 * 3 * iVar3 >> 7;
    *(int *)(m_00[3].q + 0xc) = iVar2 * 3 * iVar2;
    *(int *)m_00[3].iq = iVar4 * 3 * iVar4 >> 6;
    *(int *)(m_00[3].iq + 2) = iVar3 * iVar3 >> 7;
    *(int *)(m_00[3].iq + 10) = iVar3 * 7 * iVar3 >> 3;
    *(int *)(m_00[3].iq + 8) = iVar2 * iVar2 >> 2;
    *(int *)(m_00[3].iq + 0xc) = iVar4 * iVar4 * 2;
    *(int *)(m_00[3].iq + 6) = local_34 * iVar3 >> 5;
    CheckLambdaValue((int *)(m_00[3].q + 0xe));
    CheckLambdaValue((int *)(m_00[3].q + 0xc));
    CheckLambdaValue((int *)m_00[3].iq);
    CheckLambdaValue((int *)(m_00[3].iq + 2));
    CheckLambdaValue((int *)(m_00[3].iq + 10));
    CheckLambdaValue((int *)(m_00[3].iq + 8));
    CheckLambdaValue((int *)(m_00[3].iq + 0xc));
    CheckLambdaValue((int *)(m_00[3].iq + 6));
    *(uint *)(m_00[3].q + 10) = (uint)m_00->q[0] * 0x14;
    m_00[3].q[8] = 0;
    m_00[3].q[9] = 0;
    *(long *)m_00[3].bias = (long)(iVar3 * 1000 * iVar3);
  }
  return;
}

Assistant:

static void SetupMatrices(VP8Encoder* enc) {
  int i;
  const int tlambda_scale =
    (enc->method >= 4) ? enc->config->sns_strength
                        : 0;
  const int num_segments = enc->segment_hdr.num_segments;
  for (i = 0; i < num_segments; ++i) {
    VP8SegmentInfo* const m = &enc->dqm[i];
    const int q = m->quant;
    int q_i4, q_i16, q_uv;
    m->y1.q[0] = kDcTable[clip(q + enc->dq_y1_dc, 0, 127)];
    m->y1.q[1] = kAcTable[clip(q,                  0, 127)];

    m->y2.q[0] = kDcTable[ clip(q + enc->dq_y2_dc, 0, 127)] * 2;
    m->y2.q[1] = kAcTable2[clip(q + enc->dq_y2_ac, 0, 127)];

    m->uv.q[0] = kDcTable[clip(q + enc->dq_uv_dc, 0, 117)];
    m->uv.q[1] = kAcTable[clip(q + enc->dq_uv_ac, 0, 127)];

    q_i4  = ExpandMatrix(&m->y1, 0);
    q_i16 = ExpandMatrix(&m->y2, 1);
    q_uv  = ExpandMatrix(&m->uv, 2);

    m->lambda_i4          = (3 * q_i4 * q_i4) >> 7;
    m->lambda_i16         = (3 * q_i16 * q_i16);
    m->lambda_uv          = (3 * q_uv * q_uv) >> 6;
    m->lambda_mode        = (1 * q_i4 * q_i4) >> 7;
    m->lambda_trellis_i4  = (7 * q_i4 * q_i4) >> 3;
    m->lambda_trellis_i16 = (q_i16 * q_i16) >> 2;
    m->lambda_trellis_uv  = (q_uv * q_uv) << 1;
    m->tlambda            = (tlambda_scale * q_i4) >> 5;

    // none of these constants should be < 1
    CheckLambdaValue(&m->lambda_i4);
    CheckLambdaValue(&m->lambda_i16);
    CheckLambdaValue(&m->lambda_uv);
    CheckLambdaValue(&m->lambda_mode);
    CheckLambdaValue(&m->lambda_trellis_i4);
    CheckLambdaValue(&m->lambda_trellis_i16);
    CheckLambdaValue(&m->lambda_trellis_uv);
    CheckLambdaValue(&m->tlambda);

    m->min_disto = 20 * m->y1.q[0];   // quantization-aware min disto
    m->max_edge  = 0;

    m->i4_penalty = 1000 * q_i4 * q_i4;
  }
}